

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void readDQT(FILE *f)

{
  uint uVar1;
  int i;
  int iVar2;
  long lVar3;
  uint uVar4;
  uchar t;
  byte bVar5;
  ulong uVar6;
  uchar s;
  uchar c;
  char local_46;
  byte local_45;
  uint local_44;
  int local_40;
  uint local_3c;
  ulong local_38;
  
  uVar1 = EnterNewSection(f,"DQT");
  local_40 = uVar1 - 2;
  if (local_40 != 0) {
    do {
      fread(&local_45,1,1,(FILE *)f);
      bVar5 = local_45;
      uVar1 = (uint)(0xf < local_45) * 8 + 8;
      printf(anon_var_dwarf_2e54,(ulong)uVar1);
      local_3c = uVar1 >> 3;
      uVar4 = bVar5 & 0xf;
      local_44 = uVar1;
      printf(anon_var_dwarf_2e6b,(ulong)uVar4);
      lVar3 = 0;
      local_38 = (ulong)uVar4;
      do {
        bVar5 = 0;
        uVar1 = local_3c;
        do {
          fread(&local_46,1,1,(FILE *)f);
          bVar5 = bVar5 + local_46;
          uVar1 = uVar1 - 1;
        } while (uVar1 != 0);
        *(uint *)((long)quantTable[0] + lVar3 * 4 + (ulong)(uVar4 << 9)) = (uint)bVar5;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x40);
      iVar2 = (int)local_38;
      uVar6 = 0;
      do {
        if ((uVar6 & 7) == 0) {
          putchar(10);
        }
        printf("%2d ",(ulong)*(uint *)((long)quantTable[0] + uVar6 * 4 + (ulong)(uint)(iVar2 << 9)))
        ;
        uVar6 = uVar6 + 1;
      } while (uVar6 != 0x40);
      putchar(10);
      local_40 = local_40 + ~(local_44 << 3);
    } while (local_40 != 0);
  }
  return;
}

Assistant:

void readDQT(FILE *f) {
    unsigned int len = EnterNewSection(f, "DQT");
    len -= 2;
    while (len > 0) {
        unsigned char c;
        fread(&c, 1, 1, f);
        len--;
        unsigned precision = c >> 4 == 0 ? 8 : 16;
        printf("精度：%d\n", precision);
        precision /= 8;
        unsigned char id = c & 0x0F;
        printf("量化表ID: %d\n", id);
        for (int i = 0; i < 64; i++) {
            unsigned char t = 0;
            for (int p = 0; p < precision; p++) {
                unsigned char s;
                fread(&s, 1, 1, f);
                t == t << 8;
                t += s;
            }
            quantTable[id][i] = t;
        }
        for (int i = 0; i < 64; i++) {
            if (i % 8 == 0) {
                printf("\n");
            }
            printf("%2d ", quantTable[id][i]);
        }
        printf("\n");
        len -= (precision*64);
    }
}